

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# knote.c
# Opt level: O3

knote * knote_index_RB_MINMAX(knote_index *head,int val)

{
  knote *pkVar1;
  knote *pkVar2;
  
  pkVar2 = head->rbh_root;
  if (pkVar2 != (knote *)0x0) {
    do {
      pkVar1 = pkVar2;
      pkVar2 = (&(pkVar2->kn_index).rbe_left)[(uint)~val >> 0x1f];
    } while (pkVar2 != (knote *)0x0);
    return pkVar1;
  }
  return (knote *)0x0;
}

Assistant:

struct knote *
knote_new(void)
{
    struct knote *res;

    res = calloc(1, sizeof(struct knote));
    if (res == NULL)
        return (NULL);

    res->kn_ref = 1;

    return (res);
}